

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::SListIntermediateNode
          (SListIntermediateNode *this,TermList ts,uint childVar)

{
  (this->super_IntermediateNode).super_Node._term._content = ts._content;
  (this->super_IntermediateNode).childVar = childVar;
  (this->super_IntermediateNode).super_Node._vptr_Node =
       (_func_int **)&PTR__SListIntermediateNode_009eab80;
  Lib::
  SkipList<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*,_Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::NodePtrComparator>
  ::SkipList(&this->_nodes);
  return;
}

Assistant:

SListIntermediateNode(TermList ts, unsigned childVar) : IntermediateNode(ts, childVar) {}